

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void lexer_Init(void)

{
  ushort uVar1;
  long lVar2;
  char *pcVar3;
  long lVar4;
  uint16_t uVar5;
  ulong uVar6;
  
  uVar1 = 1;
  lVar2 = 0;
  do {
    if (lVar2 == 0xa0) {
      return;
    }
    pcVar3 = keywords[lVar2].name;
    uVar5 = 0;
    while( true ) {
      lVar4 = (long)*pcVar3;
      uVar6 = (ulong)uVar5;
      if (lVar4 == 0) break;
      if (*(short *)(uVar6 * 0x88 + 0x1a79a0 + lVar4 * 2) == 0) {
        if (0x178 < uVar1) {
          __assert_fail("usedNodes < sizeof(keywordDict) / sizeof(*keywordDict)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                        ,0x259,"lexer_Init");
        }
        *(ushort *)(uVar6 * 0x88 + 0x1a79a0 + lVar4 * 2) = uVar1;
        uVar1 = uVar1 + 1;
        lVar4 = (long)*pcVar3;
      }
      uVar5 = keywordDict[uVar6].children[lVar4 + -0x20];
      pcVar3 = pcVar3 + 1;
    }
    keywordDict[uVar6].keyword = keywords + lVar2;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void lexer_Init(void)
{
	// Build the dictionary of keywords. This could be done at compile time instead, however:
	// - Doing so manually is a task nobody wants to undertake
	// - It would be massively hard to read
	// - Doing it within CC or CPP would be quite non-trivial
	// - Doing it externally would require some extra work to use only POSIX tools
	// - The startup overhead isn't much compared to the program's
	uint16_t usedNodes = 1;

	for (size_t i = 0; i < ARRAY_SIZE(keywords); i++) {
		uint16_t nodeID = 0;

		// Walk the dictionary, creating intermediate nodes for the keyword
		for (char const *ptr = keywords[i].name; *ptr; ptr++) {
			// We should be able to assume all entries are well-formed
			if (keywordDict[nodeID].children[*ptr - ' '] == 0) {
				// If this gets tripped up, set the size of keywordDict to
				// something high, compile with `-DPRINT_NODE_COUNT` (see below),
				// and set the size to that.
				assert(usedNodes < sizeof(keywordDict) / sizeof(*keywordDict));

				// There is no node at that location, grab one from the pool
				keywordDict[nodeID].children[*ptr - ' '] = usedNodes;
				usedNodes++;
			}
			nodeID = keywordDict[nodeID].children[*ptr - ' '];
		}

		// This assumes that no two keywords have the same name
		keywordDict[nodeID].keyword = &keywords[i];
	}

#ifdef PRINT_NODE_COUNT // For the maintainer to check how many nodes are needed
	printf("Lexer keyword dictionary: %zu keywords in %u nodes (pool size %zu)\n",
	       ARRAY_SIZE(keywords), usedNodes, ARRAY_SIZE(keywordDict));
#endif
}